

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

Llb_Grp_t * Llb_ManGroupCreateFromCuts(Llb_Man_t *pMan,Vec_Int_t *vCut1,Vec_Int_t *vCut2)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  int *piVar4;
  Llb_Grp_t *pGroup;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  Aig_Obj_t *pObj;
  long lVar8;
  int iVar9;
  
  pGroup = Llb_ManGroupAlloc(pMan);
  Aig_ManIncrementTravId(pMan->pAig);
  iVar9 = vCut1->nSize;
  if (0 < (long)iVar9) {
    pAVar3 = pMan->pAig;
    piVar4 = vCut1->pArray;
    pVVar6 = pAVar3->vObjs;
    lVar8 = 0;
    do {
      iVar1 = piVar4[lVar8];
      if (((long)iVar1 < 0) || (pVVar6->nSize <= iVar1)) goto LAB_009248f6;
      *(int *)((long)pVVar6->pArray[iVar1] + 0x20) = pAVar3->nTravIds;
      lVar8 = lVar8 + 1;
    } while (iVar9 != lVar8);
  }
  if (0 < vCut2->nSize) {
    lVar8 = 0;
    do {
      pVVar6 = pMan->pAig->vObjs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        uVar2 = vCut2->pArray[lVar8];
        if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) goto LAB_009248f6;
        pvVar7 = pVVar6->pArray[uVar2];
      }
      if (*(int *)((long)pvVar7 + 0x20) != pMan->pAig->nTravIds) {
        pVVar6 = pGroup->vOuts;
        uVar2 = pVVar6->nCap;
        if (pVVar6->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_0092475f;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
          }
          pVVar6->nCap = iVar9;
        }
LAB_0092475f:
        iVar9 = pVVar6->nSize;
        pVVar6->nSize = iVar9 + 1;
        pVVar6->pArray[iVar9] = pvVar7;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCut2->nSize);
  }
  Aig_ManIncrementTravId(pMan->pAig);
  if (0 < vCut2->nSize) {
    lVar8 = 0;
    do {
      pVVar6 = pMan->pAig->vObjs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        uVar2 = vCut2->pArray[lVar8];
        if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) goto LAB_009248f6;
        pObj = (Aig_Obj_t *)pVVar6->pArray[uVar2];
      }
      Llb_ManGroupMarkNodes_rec(pMan->pAig,pObj);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCut2->nSize);
  }
  if (0 < vCut1->nSize) {
    lVar8 = 0;
    do {
      pVVar6 = pMan->pAig->vObjs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        uVar2 = vCut1->pArray[lVar8];
        if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) {
LAB_009248f6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = pVVar6->pArray[uVar2];
      }
      if (*(int *)((long)pvVar7 + 0x20) == pMan->pAig->nTravIds) {
        pVVar6 = pGroup->vIns;
        uVar2 = pVVar6->nCap;
        if (pVVar6->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_009248ac;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
          }
          pVVar6->nCap = iVar9;
        }
LAB_009248ac:
        iVar9 = pVVar6->nSize;
        pVVar6->nSize = iVar9 + 1;
        pVVar6->pArray[iVar9] = pvVar7;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCut1->nSize);
  }
  if (pGroup->vNodes == (Vec_Ptr_t *)0x0) {
    pVVar6 = Llb_ManGroupCollect(pGroup);
    pGroup->vNodes = pVVar6;
    return pGroup;
  }
  __assert_fail("p->vNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                ,0x152,
                "Llb_Grp_t *Llb_ManGroupCreateFromCuts(Llb_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFromCuts( Llb_Man_t * pMan, Vec_Int_t * vCut1, Vec_Int_t * vCut2 )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );

    // mark Cut1
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        Aig_ObjSetTravIdCurrent( pMan->pAig, pObj );
    // collect unmarked Cut2
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vOuts, pObj );

    // mark nodes reachable from Cut2
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        Llb_ManGroupMarkNodes_rec( pMan->pAig, pObj );
    // collect marked Cut1
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vIns, pObj );

    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}